

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  internals *piVar5;
  size_type sVar6;
  reference pp_Var7;
  pointer pvVar8;
  reference pptVar9;
  reference pptVar10;
  size_type sVar11;
  undefined8 in_RSI;
  long in_RDI;
  handle parent_1;
  tuple_iterator __end5_1;
  tuple_iterator __begin5_1;
  tuple *__range5_1;
  type_info *known;
  iterator __end5;
  iterator __begin5;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  bool found;
  type_info *tinfo;
  const_iterator __end4;
  const_iterator __begin4;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range4;
  const_iterator it;
  _typeobject *type;
  size_t i;
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  *type_dict;
  handle parent;
  tuple_iterator __end2;
  tuple_iterator __begin2;
  tuple *__range2;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  reference in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  handle in_stack_fffffffffffffe98;
  sequence_fast_readonly in_stack_fffffffffffffea0;
  handle local_110;
  sequence_fast_readonly local_108;
  sequence_fast_readonly local_100;
  handle local_f8;
  undefined1 local_f0 [8];
  undefined1 *local_e8;
  type_info *local_e0;
  type_info **local_d8;
  __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
  local_d0;
  undefined8 local_c8;
  byte local_b9;
  type_info *local_b8;
  type_info **local_b0;
  __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
  local_a8;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *local_a0;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_98;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_90;
  value_type local_88;
  ulong local_80;
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  *local_78;
  PyObject *local_70;
  handle local_68;
  sequence_fast_readonly local_60;
  sequence_fast_readonly local_58;
  handle local_40;
  undefined1 local_38 [8];
  undefined1 *local_30;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> local_28;
  undefined8 local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::vector
            ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)0x2a9e64);
  pybind11::handle::handle<_object_*,_0>(&local_40,*(_object **)(local_8 + 0x150));
  reinterpret_borrow<pybind11::tuple>(in_stack_fffffffffffffe98);
  local_30 = local_38;
  local_58.ptr = (PyObject **)tuple::begin((tuple *)in_stack_fffffffffffffe88.m_ptr);
  local_60.ptr = (PyObject **)tuple::end((tuple *)in_stack_fffffffffffffe88.m_ptr);
  while (bVar2 = operator!=((It *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                            (It *)in_stack_fffffffffffffe88.m_ptr), bVar2) {
    local_68.m_ptr =
         (PyObject *)
         generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator*
                   (in_stack_fffffffffffffe88.m_ptr);
    ppPVar4 = pybind11::handle::ptr(&local_68);
    local_70 = *ppPVar4;
    std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::push_back
              ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (value_type *)in_stack_fffffffffffffe88.m_ptr);
    generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
              ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  }
  tuple::~tuple((tuple *)0x2a9f1d);
  piVar5 = get_internals();
  local_78 = &piVar5->registered_types_py;
  local_80 = 0;
  do {
    uVar1 = local_80;
    sVar6 = std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::size(&local_28);
    if (sVar6 <= uVar1) {
      std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::~vector
                ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)
                 in_stack_fffffffffffffea0.ptr);
      return;
    }
    pp_Var7 = std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::operator[]
                        (&local_28,local_80);
    local_88 = *pp_Var7;
    iVar3 = _PyType_Check((PyObject *)0x2aa048);
    if (iVar3 != 0) {
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
           ::find((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                   *)in_stack_fffffffffffffe88.m_ptr,(key_type *)0x2aa067);
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
           ::end((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                  *)in_stack_fffffffffffffe88.m_ptr);
      bVar2 = std::__detail::operator!=(&local_90,&local_98);
      if (bVar2) {
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
                               *)0x2aa0bb);
        local_a0 = &pvVar8->second;
        local_a8._M_current =
             (type_info **)
             std::
             vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
             begin((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    *)in_stack_fffffffffffffe88.m_ptr);
        local_b0 = (type_info **)
                   std::
                   vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                   ::end((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          *)in_stack_fffffffffffffe88.m_ptr);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                                  (__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                   *)in_stack_fffffffffffffe88.m_ptr), bVar2) {
          pptVar9 = __gnu_cxx::
                    __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                    ::operator*(&local_a8);
          local_b8 = *pptVar9;
          local_b9 = 0;
          local_c8 = local_10;
          local_d0._M_current =
               (type_info **)
               std::
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               ::begin((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                        *)in_stack_fffffffffffffe88.m_ptr);
          local_d8 = (type_info **)
                     std::
                     vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     ::end((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            *)in_stack_fffffffffffffe88.m_ptr);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90)
                                    ,(__normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                      *)in_stack_fffffffffffffe88.m_ptr), bVar2) {
            pptVar10 = __gnu_cxx::
                       __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                       ::operator*(&local_d0);
            local_e0 = *pptVar10;
            if (local_e0 == local_b8) {
              local_b9 = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<pybind11::detail::type_info_**,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
            ::operator++(&local_d0);
          }
          if ((local_b9 & 1) == 0) {
            std::
            vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
            push_back((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)in_stack_fffffffffffffea0.ptr,(value_type *)in_stack_fffffffffffffe98.m_ptr
                     );
          }
          __gnu_cxx::
          __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
          ::operator++(&local_a8);
        }
      }
      else if (local_88->tp_bases != (PyObject *)0x0) {
        sVar6 = local_80 + 1;
        sVar11 = std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::size(&local_28);
        if (sVar6 == sVar11) {
          std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::pop_back
                    ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)0x2aa253);
          local_80 = local_80 - 1;
        }
        pybind11::handle::handle<_object_*,_0>(&local_f8,local_88->tp_bases);
        reinterpret_borrow<pybind11::tuple>(in_stack_fffffffffffffe98);
        local_e8 = local_f0;
        in_stack_fffffffffffffea0.ptr =
             (PyObject **)tuple::begin((tuple *)in_stack_fffffffffffffe88.m_ptr);
        local_100.ptr = in_stack_fffffffffffffea0.ptr;
        in_stack_fffffffffffffe98.m_ptr = (PyObject *)tuple::end(in_stack_fffffffffffffe88.m_ptr);
        local_108.ptr = (PyObject **)in_stack_fffffffffffffe98.m_ptr;
        while (in_stack_fffffffffffffe97 =
                    operator!=((It *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                               (It *)in_stack_fffffffffffffe88.m_ptr),
              (bool)in_stack_fffffffffffffe97) {
          in_stack_fffffffffffffe88 =
               generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::
               operator*(in_stack_fffffffffffffe88.m_ptr);
          local_110.m_ptr = in_stack_fffffffffffffe88.m_ptr;
          pybind11::handle::ptr(&local_110);
          std::vector<_typeobject_*,_std::allocator<_typeobject_*>_>::push_back
                    ((vector<_typeobject_*,_std::allocator<_typeobject_*>_> *)
                     CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                     (value_type *)in_stack_fffffffffffffe88.m_ptr);
          generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
                    ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
                      *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        }
        tuple::~tuple((tuple *)0x2aa314);
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases)) {
        check.push_back((PyTypeObject *) parent.ptr());
    }

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto *type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) {
            continue;
        }

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before:
            // we want to follow Python/virtual C++ rules that there should only be one instance of
            // a common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) {
                        found = true;
                        break;
                    }
                }
                if (!found) {
                    bases.push_back(tinfo);
                }
            }
        } else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases)) {
                check.push_back((PyTypeObject *) parent.ptr());
            }
        }
    }
}